

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix<Rational> __thiscall
Matrix<Rational>::joinHorizontal(Matrix<Rational> *this,Matrix<Rational> *a)

{
  Rational *pRVar1;
  long lVar2;
  uint uVar3;
  matrix_error *this_00;
  uint *in_RDX;
  Rational *extraout_RDX;
  Rational *extraout_RDX_00;
  Rational *extraout_RDX_01;
  Rational *pRVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  Matrix<Rational> MVar10;
  
  if (a->M == *in_RDX) {
    Matrix(this,a->M,in_RDX[1] + a->N);
    pRVar4 = extraout_RDX;
    if (a->M != 0) {
      uVar3 = 0;
      do {
        uVar6 = (ulong)a->N;
        if (a->N != 0) {
          lVar8 = 0x20;
          uVar5 = 0;
          do {
            pRVar4 = a->arr;
            uVar9 = (ulong)((int)uVar6 * uVar3);
            pRVar1 = this->arr;
            uVar6 = (ulong)(this->N * uVar3);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((long)pRVar1 + lVar8 + uVar6 * 0x40 + -0x20),
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((long)pRVar4 + lVar8 + uVar9 * 0x40 + -0x20));
            *(undefined1 *)((long)pRVar1 + lVar8 + -8 + uVar6 * 0x40) =
                 *(undefined1 *)((long)pRVar4 + lVar8 + -8 + uVar9 * 0x40);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((long)&pRVar1[uVar6]._numerator.digits.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar8),
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((long)&pRVar4[uVar9]._numerator.digits.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar8));
            (&pRVar1[uVar6]._numerator.negative)[lVar8] =
                 (&pRVar4[uVar9]._numerator.negative)[lVar8];
            uVar5 = uVar5 + 1;
            uVar6 = (ulong)a->N;
            lVar8 = lVar8 + 0x40;
            pRVar4 = extraout_RDX_00;
          } while (uVar5 < uVar6);
        }
        uVar6 = (ulong)in_RDX[1];
        if (in_RDX[1] != 0) {
          lVar8 = 0x20;
          uVar5 = 0;
          do {
            lVar2 = *(long *)(in_RDX + 2);
            uVar6 = (ulong)((int)uVar6 * uVar3);
            pRVar4 = this->arr + (ulong)(this->N * uVar3) + (ulong)(a->N + (int)uVar5);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pRVar4,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       (lVar8 + uVar6 * 0x40 + lVar2 + -0x20));
            lVar7 = uVar6 * 0x40 + lVar2;
            (pRVar4->_numerator).negative = *(bool *)(lVar8 + -8 + lVar7);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (&(pRVar4->_denominator).digits,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar7 + lVar8));
            (pRVar4->_denominator).negative = *(bool *)(lVar8 + 0x18 + lVar2 + uVar6 * 0x40);
            uVar5 = uVar5 + 1;
            uVar6 = (ulong)in_RDX[1];
            lVar8 = lVar8 + 0x40;
            pRVar4 = extraout_RDX_01;
          } while (uVar5 < uVar6);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < a->M);
    }
    MVar10.arr = pRVar4;
    MVar10._0_8_ = this;
    return MVar10;
  }
  this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
  matrix_error::runtime_error(this_00,"Trying to join matrices of different height");
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Matrix<Field> Matrix<Field>::joinHorizontal(const Matrix &a) const
{
    if(M != a.M)
    {
        throw matrix_error("Trying to join matrices of different height");
    }
    Matrix res(M, N + a.N);
    for(unsigned i = 0; i < M; i++)
    {
        for(unsigned j = 0; j < N; j++)
        {
            res[i][j] = (*this)[i][j];
        }
        for(unsigned j = 0; j < a.N; j++)
        {
            res[i][N + j] = a[i][j];
        }
    }
    return res;
}